

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psconv.c
# Opt level: O3

FT_Fixed PS_Conv_ToFixed(FT_Byte **cursor,FT_Byte *limit,FT_Long power_ten)

{
  bool bVar1;
  byte bVar2;
  FT_Long FVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long a_;
  undefined8 in_R11;
  ulong uVar7;
  byte *pbVar8;
  FT_Byte *pFVar9;
  ulong uVar10;
  byte *local_50;
  uint local_48;
  undefined4 local_44;
  long local_40;
  long local_38;
  
  pbVar8 = *cursor;
  if (pbVar8 < limit) {
    bVar2 = *pbVar8;
    if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
      pbVar8 = pbVar8 + 1;
      if (pbVar8 == limit) {
        return 0;
      }
      local_44 = (undefined4)CONCAT71((int7)((ulong)power_ten >> 8),bVar2 == 0x2d);
      bVar2 = *pbVar8;
      if (bVar2 == 0x2b) {
        return 0;
      }
      if (bVar2 == 0x2d) {
        return 0;
      }
    }
    else {
      local_44 = 0;
    }
    uVar7 = CONCAT71((int7)((ulong)in_R11 >> 8),1);
    local_50 = pbVar8;
    if (bVar2 == 0x2e) {
      uVar10 = 0;
    }
    else {
      uVar10 = PS_Conv_ToInt(&local_50,limit);
      if (local_50 == pbVar8) {
        return 0;
      }
      if ((long)uVar10 < 0x8000) {
        uVar10 = (ulong)(uint)((int)uVar10 << 0x10);
        uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
      }
      else {
        uVar7 = 0;
      }
    }
    lVar6 = 1;
    if ((local_50 < limit) && (*local_50 == 0x2e)) {
      pbVar8 = local_50 + 1;
      if (pbVar8 < limit) {
        pFVar9 = limit + ~(ulong)local_50;
        a_ = 0;
        do {
          uVar5 = (ulong)*pbVar8;
          local_50 = pbVar8;
          if ((((uVar5 < 0x21) && ((0x100003601U >> (uVar5 & 0x3f) & 1) != 0)) ||
              ((char)*pbVar8 < '\0')) || (uVar5 - 0x3a < 0xfffffffffffffff6)) break;
          if ((lVar6 < 0xccccccc) && (a_ < 0xccccccc)) {
            a_ = (long)ft_char_table[uVar5] + a_ * 10;
            if (power_ten < 1 || uVar10 != 0) {
              lVar6 = lVar6 * 10;
            }
            else {
              power_ten = power_ten + -1;
            }
          }
          pbVar8 = pbVar8 + 1;
          pFVar9 = pFVar9 + -1;
          local_50 = limit;
        } while (pFVar9 != (FT_Byte *)0x0);
      }
      else {
        a_ = 0;
        local_50 = pbVar8;
      }
    }
    else {
      a_ = 0;
    }
    pbVar8 = local_50 + 1;
    bVar1 = true;
    if ((pbVar8 < limit) && ((*local_50 | 0x20) == 0x65)) {
      local_48 = (uint)uVar7;
      local_50 = pbVar8;
      local_40 = a_;
      local_38 = lVar6;
      FVar3 = PS_Conv_ToInt(&local_50,limit);
      if (pbVar8 == local_50) {
        return 0;
      }
      uVar7 = (ulong)local_48;
      if (1000 < FVar3) {
        *cursor = local_50;
        uVar5 = 0x7fffffff;
        if (uVar10 == 0 && local_40 == 0) {
          return 0;
        }
        goto LAB_0022fafc;
      }
      bVar1 = -0x3e9 < FVar3;
      lVar6 = 0;
      if (-0x3e9 < FVar3) {
        lVar6 = FVar3;
      }
      power_ten = power_ten + lVar6;
      lVar6 = local_38;
      a_ = local_40;
    }
    *cursor = local_50;
    if (uVar10 != 0 || a_ != 0) {
      uVar5 = 0x7fffffff;
      if ((char)uVar7 != '\0') {
        if (!bVar1) {
          return 0;
        }
        if (power_ten < 1) {
          if (power_ten < 0) {
            do {
              if (lVar6 < 0xccccccc) {
                lVar6 = lVar6 * 10;
              }
              else {
                a_ = a_ / 10;
              }
              if ((uVar10 < 10) && (a_ == 0)) {
                return 0;
              }
              uVar10 = uVar10 / 10;
              power_ten = power_ten + 1;
            } while (power_ten != 0);
          }
        }
        else {
          lVar4 = power_ten + 1;
          do {
            if (0xccccccb < uVar10) goto LAB_0022fafc;
            if (a_ < 0xccccccc) {
              a_ = a_ * 10;
            }
            else {
              if (lVar6 == 1) goto LAB_0022fafc;
              lVar6 = lVar6 / 10;
            }
            uVar10 = uVar10 * 10;
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        uVar5 = uVar10;
        if (a_ != 0) {
          FVar3 = FT_DivFix(a_,lVar6);
          uVar5 = FVar3 + uVar5;
        }
      }
LAB_0022fafc:
      if ((char)local_44 != '\0') {
        return -uVar5;
      }
      return uVar5;
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Fixed )
  PS_Conv_ToFixed( FT_Byte**  cursor,
                   FT_Byte*   limit,
                   FT_Long    power_ten )
  {
    FT_Byte*  p = *cursor;
    FT_Byte*  curp;

    FT_Fixed  integral = 0;
    FT_Long   decimal  = 0;
    FT_Long   divider  = 1;

    FT_Bool   sign           = 0;
    FT_Bool   have_overflow  = 0;
    FT_Bool   have_underflow = 0;


    if ( p >= limit )
      goto Bad;

    if ( *p == '-' || *p == '+' )
    {
      sign = FT_BOOL( *p == '-' );

      p++;
      if ( p == limit )
        goto Bad;

      /* only a single sign is allowed */
      if ( *p == '-' || *p == '+' )
        return 0;
    }

    /* read the integer part */
    if ( *p != '.' )
    {
      curp     = p;
      integral = PS_Conv_ToInt( &p, limit );

      if ( p == curp )
        return 0;

      if ( integral > 0x7FFF )
        have_overflow = 1;
      else
        integral = (FT_Fixed)( (FT_UInt32)integral << 16 );
    }

    /* read the decimal part */
    if ( p < limit && *p == '.' )
    {
      p++;

      for ( ; p < limit; p++ )
      {
        FT_Char  c;


        if ( IS_PS_SPACE( *p ) || *p OP 0x80 )
          break;

        c = ft_char_table[*p & 0x7F];

        if ( c < 0 || c >= 10 )
          break;

        /* only add digit if we don't overflow */
        if ( divider < 0xCCCCCCCL && decimal < 0xCCCCCCCL )
        {
          decimal = decimal * 10 + c;

          if ( !integral && power_ten > 0 )
            power_ten--;
          else
            divider *= 10;
        }
      }
    }

    /* read exponent, if any */
    if ( p + 1 < limit && ( *p == 'e' || *p == 'E' ) )
    {
      FT_Long  exponent;


      p++;

      curp     = p;
      exponent = PS_Conv_ToInt( &p, limit );

      if ( curp == p )
        return 0;

      /* arbitrarily limit exponent */
      if ( exponent > 1000 )
        have_overflow = 1;
      else if ( exponent < -1000 )
        have_underflow = 1;
      else
        power_ten += exponent;
    }

    *cursor = p;

    if ( !integral && !decimal )
      return 0;

    if ( have_overflow )
      goto Overflow;
    if ( have_underflow )
      goto Underflow;

    while ( power_ten > 0 )
    {
      if ( integral >= 0xCCCCCCCL )
        goto Overflow;
      integral *= 10;

      if ( decimal >= 0xCCCCCCCL )
      {
        if ( divider == 1 )
          goto Overflow;
        divider /= 10;
      }
      else
        decimal *= 10;

      power_ten--;
    }

    while ( power_ten < 0 )
    {
      integral /= 10;
      if ( divider < 0xCCCCCCCL )
        divider *= 10;
      else
        decimal /= 10;

      if ( !integral && !decimal )
        goto Underflow;

      power_ten++;
    }

    if ( decimal )
    {
      decimal = FT_DivFix( decimal, divider );
      /* it's not necessary to check this addition for overflow */
      /* due to the structure of the real number representation */
      integral += decimal;
    }

  Exit:
    if ( sign )
      integral = -integral;

    return integral;

  Bad:
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    return 0;

  Overflow:
    integral = 0x7FFFFFFFL;
    FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    goto Exit;

  Underflow:
    FT_TRACE4(( "!!!UNDERFLOW:!!!" ));
    return 0;
  }